

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-syntax.cc
# Opt level: O0

void do_output_json(system_declaration_t *sysdecl,string *delimiter,ostream *os)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> os_00;
  system_t *this;
  element_type *s;
  undefined1 local_30 [8];
  shared_ptr<tchecker::system::system_t> system;
  ostream *os_local;
  string *delimiter_local;
  system_declaration_t *sysdecl_local;
  
  system.super___shared_ptr<tchecker::system::system_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)os;
  this = (system_t *)operator_new(0x348);
  tchecker::system::system_t::system_t(this,sysdecl);
  std::shared_ptr<tchecker::system::system_t>::shared_ptr<tchecker::system::system_t,void>
            ((shared_ptr<tchecker::system::system_t> *)local_30,this);
  os_00 = system.super___shared_ptr<tchecker::system::system_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  s = std::__shared_ptr_access<tchecker::system::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<tchecker::system::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)local_30);
  tchecker::system::output_json((ostream *)os_00._M_pi,s,delimiter);
  std::ostream::operator<<
            (system.super___shared_ptr<tchecker::system::system_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<tchecker::system::system_t>::~shared_ptr
            ((shared_ptr<tchecker::system::system_t> *)local_30);
  return;
}

Assistant:

void do_output_json(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & delimiter, std::ostream & os)
{
  std::shared_ptr<tchecker::system::system_t> system(new tchecker::system::system_t(sysdecl));
  tchecker::system::output_json(os, *system, delimiter);
  os << std::endl;
}